

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestTestHandler::GetValue(cmCTestTestHandler *this,char *tag,int *value,istream *fin)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  string line;
  char *local_1b8 [4];
  ostringstream cmCTestLog_msg;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetLineFromStream(fin,&line,(bool *)0x0,0xffffffffffffffff);
  bVar1 = std::operator==(&line,tag);
  if (bVar1) {
    std::istream::operator>>(fin,value);
    bVar1 = cmsys::SystemTools::GetLineFromStream(fin,&line,(bool *)0x0,0xffffffffffffffff);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"parse error: missing tag: ");
    poVar2 = std::operator<<(poVar2,tag);
    poVar2 = std::operator<<(poVar2," found [");
    poVar2 = std::operator<<(poVar2,(string *)&line);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x4fe,local_1b8[0],false);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&line);
  return bVar1;
}

Assistant:

bool cmCTestTestHandler::GetValue(const char* tag, int& value,
                                  std::istream& fin)
{
  std::string line;
  bool ret = true;
  cmSystemTools::GetLineFromStream(fin, line);
  if (line == tag) {
    fin >> value;
    ret = cmSystemTools::GetLineFromStream(fin, line); // read blank line
  } else {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "parse error: missing tag: " << tag << " found [" << line << "]"
                                            << std::endl);
    ret = false;
  }
  return ret;
}